

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void __thiscall
cppwinrt::write_structs(cppwinrt::writer&,std::vector<winmd::reader::TypeDef,std::allocator<winmd::
reader::TypeDef>>const&)::complex_struct::complex_struct(cppwinrt::writer&,winmd::reader::
TypeDef_const__(void *this,writer *w,TypeDef *type)

{
  uint32_t *values;
  undefined8 uVar1;
  bool bVar2;
  Field *pFVar3;
  TypeSig *args;
  string_view sVar4;
  FieldSig local_168;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  string local_b0;
  string_view local_90;
  const_reference local_80;
  value_type *field;
  Field __end2;
  Field __begin2;
  pair<winmd::reader::Field,_winmd::reader::Field> *__range2;
  TypeDef *type_local;
  writer *w_local;
  complex_struct *this_local;
  
  uVar1 = *(undefined8 *)&(type->super_row_base<winmd::reader::TypeDef>).m_index;
  *(table_base **)this = (type->super_row_base<winmd::reader::TypeDef>).m_table;
  *(undefined8 *)((long)this + 8) = uVar1;
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)((long)this + 0x10));
  bVar2 = has_reference(winmd::reader::TypeDef_const__(type);
  *(byte *)((long)this + 0x28) = ~bVar2 & 1;
  winmd::reader::TypeDef::FieldList
            ((pair<winmd::reader::Field,_winmd::reader::Field> *)
             &__begin2.super_row_base<winmd::reader::Field>.m_index,type);
  values = &__begin2.super_row_base<winmd::reader::Field>.m_index;
  pFVar3 = winmd::reader::begin<winmd::reader::Field>
                     ((pair<winmd::reader::Field,_winmd::reader::Field> *)values);
  __end2.super_row_base<winmd::reader::Field>._8_8_ =
       (pFVar3->super_row_base<winmd::reader::Field>).m_table;
  __begin2.super_row_base<winmd::reader::Field>.m_table =
       *(table_base **)&(pFVar3->super_row_base<winmd::reader::Field>).m_index;
  pFVar3 = winmd::reader::end<winmd::reader::Field>
                     ((pair<winmd::reader::Field,_winmd::reader::Field> *)values);
  field = (value_type *)(pFVar3->super_row_base<winmd::reader::Field>).m_table;
  __end2.super_row_base<winmd::reader::Field>.m_table =
       *(table_base **)&(pFVar3->super_row_base<winmd::reader::Field>).m_index;
  while( true ) {
    bVar2 = winmd::reader::row_base<winmd::reader::Field>::operator!=
                      ((row_base<winmd::reader::Field> *)
                       &__end2.super_row_base<winmd::reader::Field>.m_index,
                       (row_base<winmd::reader::Field> *)&field);
    if (!bVar2) break;
    local_80 = winmd::reader::row_base<winmd::reader::Field>::operator*
                         ((row_base<winmd::reader::Field> *)
                          &__end2.super_row_base<winmd::reader::Field>.m_index);
    sVar4 = winmd::reader::Field::Name(local_80);
    local_90 = sVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"%");
    winmd::reader::Field::Signature(&local_168,local_80);
    args = winmd::reader::FieldSig::Type(&local_168);
    writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
              (&local_b0,&w->super_writer_base<cppwinrt::writer>,&local_c0,args);
    ::std::
    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
                *)((long)this + 0x10),&local_90,&local_b0);
    ::std::__cxx11::string::~string((string *)&local_b0);
    winmd::reader::FieldSig::~FieldSig(&local_168);
    winmd::reader::row_base<winmd::reader::Field>::operator++
              ((row_base<winmd::reader::Field> *)
               &__end2.super_row_base<winmd::reader::Field>.m_index);
  }
  return;
}

Assistant:

complex_struct(writer& w, TypeDef const& type) :
                type(type),
                is_noexcept(!has_reference(type))
            {
                for (auto&& field : type.FieldList())
                {
                    fields.emplace_back(field.Name(), w.write_temp("%", field.Signature().Type()));
                }
            }